

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O0

int convolution_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  convolution_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  if (field == 1) {
    *(bool *)value = segment->mix == convolution_segment_mix_bypass;
  }
  else if (field == 2) {
    *(undefined4 *)value = *(undefined4 *)((long)segment->data + 0x60);
  }
  else {
    if (field != 0x29) {
      mixed_err(7);
      return 0;
    }
    *(undefined4 *)value = *(undefined4 *)((long)segment->data + 100);
  }
  return 1;
}

Assistant:

int convolution_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct convolution_segment_data *data = (struct convolution_segment_data *)segment->data;
  switch(field){
  case MIXED_SAMPLERATE: *((uint32_t *)value) = data->samplerate; break;
  case MIXED_MIX: *((float *)value) = data->mix; break;
  case MIXED_BYPASS: *((bool *)value) = (segment->mix == convolution_segment_mix_bypass); break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}